

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_10uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  
  uVar6 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      bVar4 = pSrc[3];
      bVar5 = pSrc[4];
      pSrc = pSrc + 5;
      pDst[uVar6] = (uint)(bVar2 >> 6) + (uint)bVar1 * 4;
      pDst[uVar6 + 1] = (uint)(bVar3 >> 4) | (bVar2 & 0x3f) << 4;
      pDst[uVar6 + 2] = (uint)(bVar4 >> 2) | (bVar3 & 0xf) << 6;
      pDst[uVar6 + 3] = (bVar4 & 3) << 8 | (uint)bVar5;
      uVar6 = uVar6 + 4;
    } while (uVar6 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar6] = (uint)(bVar1 >> 6) + (uint)*pSrc * 4;
    iVar7 = (int)(length & 3);
    if (iVar7 != 1) {
      bVar2 = pSrc[2];
      pDst[uVar6 + 1] = (uint)(bVar2 >> 4) | (bVar1 & 0x3f) << 4;
      if (iVar7 == 3) {
        pDst[uVar6 + 2] = (uint)(pSrc[3] >> 2) | (bVar2 & 0xf) << 6;
      }
    }
  }
  return;
}

Assistant:

static void tif_10uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 2) | (val1 >> 6));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3FU) << 4) | (val2 >> 4));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0xFU) << 6) | (val3 >> 2));
        pDst[i + 3] = (OPJ_INT32)(((val3 & 0x3U) << 8) | val4);

    }
    if (length & 3U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        length = length & 3U;
        pDst[i + 0] = (OPJ_INT32)((val0 << 2) | (val1 >> 6));

        if (length > 1U) {
            OPJ_UINT32 val2 = *pSrc++;
            pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3FU) << 4) | (val2 >> 4));
            if (length > 2U) {
                OPJ_UINT32 val3 = *pSrc++;
                pDst[i + 2] = (OPJ_INT32)(((val2 & 0xFU) << 6) | (val3 >> 2));
            }
        }
    }
}